

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumDescriptor::CopyTo(EnumDescriptor *this,EnumDescriptorProto *proto)

{
  int32 iVar1;
  uint uVar2;
  long lVar3;
  EnumValueDescriptorProto *proto_00;
  EnumDescriptorProto_EnumReservedRange *pEVar4;
  EnumOptions *pEVar5;
  EnumOptions *pEVar6;
  int i;
  long lVar7;
  int i_1;
  long lVar8;
  int i_2;
  
  EnumDescriptorProto::_internal_set_name(proto,*(string **)this);
  lVar8 = 0;
  for (lVar7 = 0; lVar7 < *(int *)(this + 0x2c); lVar7 = lVar7 + 1) {
    lVar3 = *(long *)(this + 0x30);
    proto_00 = RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::Add(&proto->value_);
    EnumValueDescriptor::CopyTo((EnumValueDescriptor *)(lVar3 + lVar8),proto_00);
    lVar8 = lVar8 + 0x28;
  }
  for (lVar7 = 0; lVar7 < *(int *)(this + 0x38); lVar7 = lVar7 + 1) {
    pEVar4 = RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::Add
                       (&proto->reserved_range_);
    lVar8 = *(long *)(this + 0x40);
    iVar1 = *(int32 *)(lVar8 + lVar7 * 8);
    uVar2 = (pEVar4->_has_bits_).has_bits_[0];
    (pEVar4->_has_bits_).has_bits_[0] = uVar2 | 1;
    pEVar4->start_ = iVar1;
    iVar1 = *(int32 *)(lVar8 + 4 + lVar7 * 8);
    (pEVar4->_has_bits_).has_bits_[0] = uVar2 | 3;
    pEVar4->end_ = iVar1;
  }
  for (lVar7 = 0; lVar7 < *(int *)(this + 0x3c); lVar7 = lVar7 + 1) {
    EnumDescriptorProto::add_reserved_name(proto,*(string **)(*(long *)(this + 0x48) + lVar7 * 8));
  }
  pEVar6 = *(EnumOptions **)(this + 0x20);
  pEVar5 = EnumOptions::default_instance();
  if (pEVar6 != pEVar5) {
    pEVar6 = EnumDescriptorProto::_internal_mutable_options(proto);
    EnumOptions::CopyFrom(pEVar6,*(EnumOptions **)(this + 0x20));
    return;
  }
  return;
}

Assistant:

void EnumDescriptor::CopyTo(EnumDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < value_count(); i++) {
    value(i)->CopyTo(proto->add_value());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    EnumDescriptorProto::EnumReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &EnumOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}